

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::PageHeader::printTo(PageHeader *this,ostream *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _PageHeader__isset _Var2;
  type *val;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"PageHeader(",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(out,"type=",5);
  to_string_abi_cxx11_(&local_c8,(duckdb_parquet *)&this->type,val);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_c8._M_dataplus._M_p,local_c8._M_string_length);
  paVar1 = &local_c8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"uncompressed_page_size=",0x17);
  duckdb_apache::thrift::to_string<int>(&local_c8,&this->uncompressed_page_size);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_c8._M_dataplus._M_p,local_c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"compressed_page_size=",0x15);
  duckdb_apache::thrift::to_string<int>(&local_c8,&this->compressed_page_size);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_c8._M_dataplus._M_p,local_c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"crc=",4);
  _Var2 = this->__isset;
  if (((byte)_Var2 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<int>(&local_c8,&this->crc);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_c8._M_dataplus._M_p,local_c8._M_string_length);
  }
  if ((((byte)_Var2 & 1) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1)) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"data_page_header=",0x11);
  _Var2 = this->__isset;
  if (((byte)_Var2 & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::DataPageHeader>
              (&local_48,&this->data_page_header);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_48._M_dataplus._M_p,local_48._M_string_length);
  }
  if ((((byte)_Var2 & 2) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2)) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"index_page_header=",0x12);
  _Var2 = this->__isset;
  if (((byte)_Var2 & 4) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::IndexPageHeader>
              (&local_68,&this->index_page_header);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_68._M_dataplus._M_p,local_68._M_string_length);
  }
  if ((((byte)_Var2 & 4) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2)) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"dictionary_page_header=",0x17);
  _Var2 = this->__isset;
  if (((byte)_Var2 & 8) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::DictionaryPageHeader>
              (&local_88,&this->dictionary_page_header);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_88._M_dataplus._M_p,local_88._M_string_length);
  }
  if ((((byte)_Var2 & 8) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2)) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"data_page_header_v2=",0x14);
  _Var2 = this->__isset;
  if (((byte)_Var2 & 0x10) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::DataPageHeaderV2>
              (&local_a8,&this->data_page_header_v2);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_a8._M_dataplus._M_p,local_a8._M_string_length);
  }
  if ((((byte)_Var2 & 0x10) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2)) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  return;
}

Assistant:

void PageHeader::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "PageHeader(";
  out << "type=" << to_string(type);
  out << ", " << "uncompressed_page_size=" << to_string(uncompressed_page_size);
  out << ", " << "compressed_page_size=" << to_string(compressed_page_size);
  out << ", " << "crc="; (__isset.crc ? (out << to_string(crc)) : (out << "<null>"));
  out << ", " << "data_page_header="; (__isset.data_page_header ? (out << to_string(data_page_header)) : (out << "<null>"));
  out << ", " << "index_page_header="; (__isset.index_page_header ? (out << to_string(index_page_header)) : (out << "<null>"));
  out << ", " << "dictionary_page_header="; (__isset.dictionary_page_header ? (out << to_string(dictionary_page_header)) : (out << "<null>"));
  out << ", " << "data_page_header_v2="; (__isset.data_page_header_v2 ? (out << to_string(data_page_header_v2)) : (out << "<null>"));
  out << ")";
}